

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8AllCertificatesSamePolicyTest1Subpart3<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section8AllCertificatesSamePolicyTest1Subpart3
          (Section8AllCertificatesSamePolicyTest1Subpart3<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  Section8AllCertificatesSamePolicyTest1Subpart3<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  ~Section8AllCertificatesSamePolicyTest1Subpart3(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8AllCertificatesSamePolicyTest1Subpart3) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "ValidCertificatePathTest1EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.1";
  info.should_validate = false;
  info.SetInitialPolicySet("NIST-test-policy-2");
  info.SetInitialExplicitPolicy(true);
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}